

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O1

uint64_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
getUIntUnchecked(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  pbVar3 = *(byte **)this;
  bVar1 = *pbVar3;
  if ((bVar1 & 0xf8) != 0x28) {
    if ((byte)(bVar1 - 0x30) < 10) {
      return (ulong)(bVar1 & 0xf);
    }
switchD_0010c8ec_default:
    return 0;
  }
  switch(bVar1) {
  case 0x28:
    return (ulong)pbVar3[1];
  case 0x29:
    return (ulong)*(ushort *)(pbVar3 + 1);
  case 0x2a:
    uVar5 = (ulong)((uint)pbVar3[2] << 8 | (uint)pbVar3[3] << 0x10);
    uVar4 = (ulong)pbVar3[1];
    goto LAB_0010c950;
  case 0x2b:
    return (ulong)*(uint *)(pbVar3 + 1);
  case 0x2c:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar4 = (ulong)pbVar3[5];
    break;
  case 0x2d:
    uVar2 = *(uint *)(pbVar3 + 1);
    uVar4 = (ulong)*(ushort *)(pbVar3 + 5);
    break;
  case 0x2e:
    uVar5 = (ulong)*(uint3 *)(pbVar3 + 5) << 0x20;
    uVar4 = (ulong)*(uint *)(pbVar3 + 1);
    goto LAB_0010c950;
  case 0x2f:
    return *(uint64_t *)(pbVar3 + 1);
  default:
    goto switchD_0010c8ec_default;
  }
  uVar5 = (ulong)uVar2;
  uVar4 = uVar4 << 0x20;
LAB_0010c950:
  return uVar4 | uVar5;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }